

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::recalculate_unchoke_slots(session_impl *this)

{
  byte *pbVar1;
  session_settings *psVar2;
  counters *this_00;
  peer_connection *this_01;
  _func_int *p_Var3;
  element_type *this_02;
  pointer pppVar4;
  element_type *this_03;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  time_point tVar10;
  _Base_ptr p_Var11;
  long lVar12;
  int64_t iVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pppVar14;
  shared_ptr<libtorrent::aux::peer_connection> p;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  peers;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_60;
  time_duration local_50;
  session_settings *local_48;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_40;
  undefined4 extraout_var;
  
  tVar10 = time_now();
  lVar12 = (this->m_last_choke).__d.__r;
  (this->m_last_choke).__d.__r = (rep)tVar10.__d.__r;
  psVar2 = &this->m_settings;
  iVar6 = session_settings::get_int(psVar2,0x401f);
  if (iVar6 == 0) {
    iVar6 = session_settings::get_int(psVar2,0x4053);
    if (iVar6 < 0) {
      counters::set_value(&this->m_stats_counters,0xfd,0x7fffffff);
      return;
    }
  }
  peers.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peers.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  peers.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var11 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = &this->m_stats_counters;
  local_50.__r = (long)tVar10.__d.__r - lVar12;
  local_48 = psVar2;
  while (psVar2 = local_48,
        (_Rb_tree_header *)p_Var11 != &(this->m_connections)._M_t._M_impl.super__Rb_tree_header) {
    ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
               (p_Var11 + 1));
    p_Var11 = (_Base_ptr)::std::_Rb_tree_increment(p_Var11);
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_40,
               &((p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&local_40);
    this_03 = local_60._M_ptr;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_40._M_refcount);
    iVar6 = (*((p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
    lVar12 = CONCAT44(extraout_var,iVar6);
    bVar5 = peer_connection::ignore_unchoke_slots
                      (p.
                       super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (((lVar12 == 0) || ((element_type *)this_03 == (element_type *)0x0 || bVar5)) ||
       (*(int *)(lVar12 + 0x1b) < 0)) {
LAB_00289d77:
      peer_connection::reset_choke_counters
                (p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    else {
      bVar5 = torrent::is_paused(this_03);
      if (bVar5) goto LAB_00289d77;
      if (((p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->field_0x887 & 2) == 0) {
LAB_00289d35:
        iVar6 = (*((p.
                    super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])();
        if ((char)iVar6 == '\0') {
          if ((*(byte *)(lVar12 + 0x1b) & 0x40) != 0) {
            counters::inc_stats_counter(this_00,0xea,-1);
            *(byte *)(lVar12 + 0x1b) = *(byte *)(lVar12 + 0x1b) & 0xbf;
            this->m_optimistic_unchoke_time_scaler = 0;
          }
          torrent::choke_peer(this_03,p.
                                      super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
        }
        goto LAB_00289d77;
      }
      iVar6 = (*((p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
      if (((char)iVar6 != '\0') ||
         ((((p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_peer_connection_hot_members).field_0x28 & 2) != 0)) goto LAB_00289d35;
      local_60._M_ptr =
           (element_type *)
           p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ::std::
      vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>::
      emplace_back<libtorrent::aux::peer_connection*>
                ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                  *)&peers,(peer_connection **)&local_60);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  uVar7 = unchoke_sort(&peers,local_50,local_48);
  iVar6 = session_settings::get_int(psVar2,0x401f);
  uVar8 = uVar7;
  if (iVar6 == 0) {
    uVar8 = get_int_setting(this,0x4053);
  }
  counters::set_value(this_00,0xfd,(long)(int)uVar8);
  if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
    session_log(this,"RECALCULATE UNCHOKE SLOTS: [ peers: %d eligible-peers: %d allowed-slots: %d ]"
                ,(ulong)(uint)(this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count
                ,(ulong)((long)peers.
                               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)peers.
                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3,(ulong)uVar7);
  }
  iVar13 = counters::operator[](this_00,0xea);
  pppVar4 = peers.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  iVar6 = (int)iVar13;
  if ((int)iVar13 == 0) {
    iVar6 = 1;
    if (1 < (int)uVar7 / 5) {
      iVar6 = (int)uVar7 / 5;
    }
  }
  iVar6 = uVar7 - iVar6;
  pppVar14 = peers.
             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pppVar14 == pppVar4) {
      ::std::
      _Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ::~_Vector_base(&peers.
                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     );
      return;
    }
    this_01 = *pppVar14;
    peer_connection::reset_choke_counters(this_01);
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&local_60,
               &(this_01->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&p,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
    this_02 = p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_refcount);
    p_Var3 = (this_01->super_bandwidth_socket)._vptr_bandwidth_socket[0xc];
    if (iVar6 < 1) {
      iVar9 = (*p_Var3)(this_01);
      if ((char)iVar9 == '\0') {
        iVar9 = (*(this_01->super_bandwidth_socket)._vptr_bandwidth_socket[7])(this_01);
        if ((*(byte *)(CONCAT44(extraout_var_02,iVar9) + 0x1b) & 0x40) == 0) {
          torrent::choke_peer((torrent *)this_02,this_01);
        }
      }
    }
    else {
      iVar9 = (*p_Var3)(this_01);
      if ((char)iVar9 != '\0') {
        bVar5 = torrent::unchoke_peer((torrent *)this_02,this_01,false);
        if (!bVar5) goto LAB_00289f19;
      }
      iVar9 = (*(this_01->super_bandwidth_socket)._vptr_bandwidth_socket[7])(this_01);
      iVar6 = iVar6 + -1;
      if ((*(byte *)(CONCAT44(extraout_var_00,iVar9) + 0x1b) & 0x40) != 0) {
        this->m_optimistic_unchoke_time_scaler = 0;
        iVar9 = (*(this_01->super_bandwidth_socket)._vptr_bandwidth_socket[7])(this_01);
        pbVar1 = (byte *)(CONCAT44(extraout_var_01,iVar9) + 0x1b);
        *pbVar1 = *pbVar1 & 0xbf;
        counters::inc_stats_counter(this_00,0xea,-1);
      }
    }
LAB_00289f19:
    pppVar14 = pppVar14 + 1;
  } while( true );
}

Assistant:

void session_impl::recalculate_unchoke_slots()
	{
		TORRENT_ASSERT(is_single_thread());

		time_point const now = aux::time_now();
		time_duration const unchoke_interval = now - m_last_choke;
		m_last_choke = now;

		// if we unchoke everyone, skip this logic
		if (settings().get_int(settings_pack::choking_algorithm) == settings_pack::fixed_slots_choker
			&& settings().get_int(settings_pack::unchoke_slots_limit) < 0)
		{
			m_stats_counters.set_value(counters::num_unchoke_slots, std::numeric_limits<int>::max());
			return;
		}

		// build list of all peers that are
		// unchokable.
		// TODO: 3 there should be a pre-calculated list of all peers eligible for
		// unchoking
		std::vector<peer_connection*> peers;
		for (auto i = m_connections.begin(); i != m_connections.end();)
		{
			std::shared_ptr<peer_connection> p = *i;
			TORRENT_ASSERT(p);
			++i;
			torrent* const t = p->associated_torrent().lock().get();
			torrent_peer* const pi = p->peer_info_struct();

			if (p->ignore_unchoke_slots() || t == nullptr || pi == nullptr
				|| pi->web_seed || t->is_paused())
			{
				p->reset_choke_counters();
				continue;
			}

			if (!p->is_peer_interested()
				|| p->is_disconnecting()
				|| p->is_connecting())
			{
				// this peer is not unchokable. So, if it's unchoked
				// already, make sure to choke it.
				if (p->is_choked())
				{
					p->reset_choke_counters();
					continue;
				}
				if (pi && pi->optimistically_unchoked)
				{
					m_stats_counters.inc_stats_counter(counters::num_peers_up_unchoked_optimistic, -1);
					pi->optimistically_unchoked = false;
					// force a new optimistic unchoke
					m_optimistic_unchoke_time_scaler = 0;
					// TODO: post a message to have this happen
					// immediately instead of waiting for the next tick
				}
				t->choke_peer(*p);
				p->reset_choke_counters();
				continue;
			}

			peers.push_back(p.get());
		}

		int const allowed_upload_slots = unchoke_sort(peers
			, unchoke_interval, m_settings);

		if (m_settings.get_int(settings_pack::choking_algorithm) == settings_pack::fixed_slots_choker)
		{
			int const upload_slots = get_int_setting(settings_pack::unchoke_slots_limit);
			m_stats_counters.set_value(counters::num_unchoke_slots, upload_slots);
		}
		else
		{
			m_stats_counters.set_value(counters::num_unchoke_slots
				, allowed_upload_slots);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("RECALCULATE UNCHOKE SLOTS: [ peers: %d "
				"eligible-peers: %d"
				" allowed-slots: %d ]"
				, int(m_connections.size())
				, int(peers.size())
				, allowed_upload_slots);
		}
#endif

		int const unchoked_counter_optimistic
			= int(m_stats_counters[counters::num_peers_up_unchoked_optimistic]);
		int const num_opt_unchoke = (unchoked_counter_optimistic == 0)
			? std::max(1, allowed_upload_slots / 5) : unchoked_counter_optimistic;

		int unchoke_set_size = allowed_upload_slots - num_opt_unchoke;

		// go through all the peers and unchoke the first ones and choke
		// all the other ones.
		for (auto* const p : peers)
		{
			TORRENT_ASSERT(p != nullptr);
			TORRENT_ASSERT(!p->ignore_unchoke_slots());

			// this will update the m_uploaded_at_last_unchoke
			p->reset_choke_counters();

			torrent* t = p->associated_torrent().lock().get();
			TORRENT_ASSERT(t);

			if (unchoke_set_size > 0)
			{
				// yes, this peer should be unchoked
				if (p->is_choked())
				{
					if (!t->unchoke_peer(*p))
						continue;
				}

				--unchoke_set_size;

				TORRENT_ASSERT(p->peer_info_struct());
				if (p->peer_info_struct()->optimistically_unchoked)
				{
					// force a new optimistic unchoke
					// since this one just got promoted into the
					// proper unchoke set
					m_optimistic_unchoke_time_scaler = 0;
					p->peer_info_struct()->optimistically_unchoked = false;
					m_stats_counters.inc_stats_counter(counters::num_peers_up_unchoked_optimistic, -1);
				}
			}
			else
			{
				// no, this peer should be choked
				TORRENT_ASSERT(p->peer_info_struct());
				if (!p->is_choked() && !p->peer_info_struct()->optimistically_unchoked)
					t->choke_peer(*p);
			}
		}
	}